

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

void __thiscall sf::Texture::swap(Texture *this,Texture *right)

{
  bool bVar1;
  uint uVar2;
  Vector2u VVar3;
  Uint64 UVar4;
  
  VVar3 = this->m_size;
  this->m_size = right->m_size;
  right->m_size = VVar3;
  VVar3 = this->m_actualSize;
  this->m_actualSize = right->m_actualSize;
  right->m_actualSize = VVar3;
  uVar2 = this->m_texture;
  this->m_texture = right->m_texture;
  right->m_texture = uVar2;
  bVar1 = this->m_isSmooth;
  this->m_isSmooth = right->m_isSmooth;
  right->m_isSmooth = bVar1;
  bVar1 = this->m_sRgb;
  this->m_sRgb = right->m_sRgb;
  right->m_sRgb = bVar1;
  bVar1 = this->m_isRepeated;
  this->m_isRepeated = right->m_isRepeated;
  right->m_isRepeated = bVar1;
  bVar1 = this->m_pixelsFlipped;
  this->m_pixelsFlipped = right->m_pixelsFlipped;
  right->m_pixelsFlipped = bVar1;
  bVar1 = this->m_fboAttachment;
  this->m_fboAttachment = right->m_fboAttachment;
  right->m_fboAttachment = bVar1;
  bVar1 = this->m_hasMipmap;
  this->m_hasMipmap = right->m_hasMipmap;
  right->m_hasMipmap = bVar1;
  UVar4 = anon_unknown.dwarf_206646::TextureImpl::getUniqueId();
  this->m_cacheId = UVar4;
  UVar4 = anon_unknown.dwarf_206646::TextureImpl::getUniqueId();
  right->m_cacheId = UVar4;
  return;
}

Assistant:

void Texture::swap(Texture& right)
{
    std::swap(m_size,          right.m_size);
    std::swap(m_actualSize,    right.m_actualSize);
    std::swap(m_texture,       right.m_texture);
    std::swap(m_isSmooth,      right.m_isSmooth);
    std::swap(m_sRgb,          right.m_sRgb);
    std::swap(m_isRepeated,    right.m_isRepeated);
    std::swap(m_pixelsFlipped, right.m_pixelsFlipped);
    std::swap(m_fboAttachment, right.m_fboAttachment);
    std::swap(m_hasMipmap,     right.m_hasMipmap);

    m_cacheId = TextureImpl::getUniqueId();
    right.m_cacheId = TextureImpl::getUniqueId();
}